

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validators.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Option *pOVar1;
  ostream *poVar2;
  allocator local_5d7;
  allocator local_5d6;
  allocator local_5d5;
  int count;
  string local_5d0;
  string local_5b0;
  string file;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  Validator local_4b0;
  Validator local_448;
  Validator local_3e0;
  App app;
  
  std::__cxx11::string::string((string *)&local_4d0,"Validator checker",(allocator *)&local_4b0);
  std::__cxx11::string::string((string *)&local_4f0,"",(allocator *)&file);
  CLI::App::App(&app,&local_4d0,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  file._M_dataplus._M_p = (pointer)&file.field_2;
  file._M_string_length = 0;
  file.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_510,"-f,--file,file",(allocator *)&local_5b0);
  std::__cxx11::string::string((string *)&local_530,"File name",(allocator *)&local_5d0);
  pOVar1 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&app,&local_510,&file,&local_530);
  CLI::Validator::Validator(&local_3e0,(Validator *)CLI::ExistingFile);
  std::__cxx11::string::string((string *)&local_4b0,"",(allocator *)&count);
  CLI::Option::check(pOVar1,&local_3e0,(string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  CLI::Validator::~Validator(&local_3e0);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_510);
  count = 0;
  std::__cxx11::string::string((string *)&local_550,"-v,--value",&local_5d5);
  std::__cxx11::string::string((string *)&local_570,"Value in range",&local_5d6);
  pOVar1 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (&app,&local_550,&count,&local_570);
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  local_5b0._M_string_length = 0;
  local_5b0.field_2._M_local_buf[0] = '\0';
  CLI::Range::Range<int>((Range *)&local_4b0,3,6,&local_5b0);
  CLI::Validator::Validator(&local_448,&local_4b0);
  std::__cxx11::string::string((string *)&local_5d0,"",&local_5d7);
  CLI::Option::check(pOVar1,&local_448,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  CLI::Validator::~Validator(&local_448);
  CLI::Validator::~Validator(&local_4b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_550);
  CLI::App::parse_char_t<char>(&app,argc,argv);
  poVar2 = std::operator<<((ostream *)&std::cout,"Try printing help or failing the validator");
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)&file);
  CLI::App::~App(&app);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("Validator checker");

    std::string file;
    app.add_option("-f,--file,file", file, "File name")->check(CLI::ExistingFile);

    int count{0};
    app.add_option("-v,--value", count, "Value in range")->check(CLI::Range(3, 6));
    CLI11_PARSE(app, argc, argv);

    std::cout << "Try printing help or failing the validator" << '\n';

    return 0;
}